

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

Type __thiscall wasm::TypeMapper::getNewType(TypeMapper *this,Type type)

{
  HeapType HVar1;
  Type type_00;
  Type local_20;
  Type type_local;
  
  if ((type.id & 1) == 0 && 6 < type.id) {
    local_20.id = type.id;
    HVar1 = wasm::Type::getHeapType(&local_20);
    HVar1 = getNewHeapType(this,HVar1);
    type_00 = wasm::Type::with(&local_20,HVar1);
    type = GlobalTypeRewriter::getTempType(&this->super_GlobalTypeRewriter,type_00);
  }
  return (Type)type.id;
}

Assistant:

Type getNewType(Type type) {
    if (!type.isRef()) {
      return type;
    }
    return getTempType(type.with(getNewHeapType(type.getHeapType())));
  }